

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointstepper.c
# Opt level: O2

SUNErrCode
SUNAdjointStepper_RecomputeFwd
          (SUNAdjointStepper self,suncountertype start_idx,sunrealtype t0,N_Vector y0,sunrealtype tf
          )

{
  SUNStepper_conflict stepper;
  sunrealtype fwd_t;
  
  stepper = self->fwd_sunstepper;
  fwd_t = t0;
  SUNStepper_Reset(stepper,t0,y0);
  SUNStepper_ResetCheckpointIndex(stepper,start_idx);
  SUNAdjointCheckpointScheme_EnableDense(self->checkpoint_scheme,1);
  SUNStepper_SetStopTime(stepper,tf);
  SUNStepper_Evolve(stepper,tf,y0,&fwd_t);
  self->nrecompute = self->nrecompute + 1;
  SUNAdjointCheckpointScheme_EnableDense(self->checkpoint_scheme,0);
  return 0;
}

Assistant:

SUNErrCode SUNAdjointStepper_RecomputeFwd(SUNAdjointStepper self,
                                          suncountertype start_idx,
                                          sunrealtype t0, N_Vector y0,
                                          sunrealtype tf)
{
  SUNFunctionBegin(self->sunctx);

  SUNErrCode retcode = SUN_SUCCESS;

  sunrealtype fwd_t      = t0;
  SUNStepper fwd_stepper = self->fwd_sunstepper;
  SUNCheckCall(SUNStepper_Reset(fwd_stepper, t0, y0));
  SUNCheckCall(SUNStepper_ResetCheckpointIndex(fwd_stepper, start_idx));

  SUNCheckCall(SUNAdjointCheckpointScheme_EnableDense(self->checkpoint_scheme, 1));

  SUNCheckCall(SUNStepper_SetStopTime(fwd_stepper, tf));

  SUNCheckCall(SUNStepper_Evolve(fwd_stepper, tf, y0, &fwd_t));
  self->nrecompute++;

  SUNCheckCall(SUNAdjointCheckpointScheme_EnableDense(self->checkpoint_scheme, 0));

  return retcode;
}